

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O0

void __thiscall sznet::net::Acceptor::~Acceptor(Acceptor *this)

{
  char *in_RSI;
  Acceptor *this_local;
  
  Channel::disableAll(&this->m_acceptChannel);
  Channel::remove(&this->m_acceptChannel,in_RSI);
  sockets::sz_closesocket(this->m_idleFd);
  std::function<void_(int,_const_sznet::net::InetAddress_&)>::~function
            (&this->m_newConnectionCallback);
  Channel::~Channel(&this->m_acceptChannel);
  Socket::~Socket(&this->m_acceptSocket);
  return;
}

Assistant:

Acceptor::~Acceptor()
{
	m_acceptChannel.disableAll();
	m_acceptChannel.remove();
	sockets::sz_closesocket(m_idleFd);
}